

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

int unpack(lua_State *L)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  lua_Integer lVar4;
  uint uVar5;
  int size;
  
  luaL_checktype(L,1,5);
  uVar3 = luaL_optinteger(L,2,1);
  iVar1 = lua_type(L,3);
  if (iVar1 < 1) {
    iVar1 = luaL_len(L,1);
  }
  else {
    lVar4 = luaL_checkinteger(L,3);
    iVar1 = (int)lVar4;
  }
  uVar5 = iVar1 - (int)uVar3;
  if ((int)uVar3 <= iVar1) {
    if (uVar5 < 0x7ffffff6) {
      size = uVar5 + 1;
      iVar2 = lua_checkstack(L,size);
      if (iVar2 != 0) {
        do {
          lua_rawgeti(L,1,(int)uVar3);
          uVar5 = (int)uVar3 + 1;
          uVar3 = (ulong)uVar5;
        } while (iVar1 + 1U != uVar5);
        return size;
      }
    }
    iVar1 = luaL_error(L,"too many results to unpack");
    return iVar1;
  }
  return 0;
}

Assistant:

static int unpack (lua_State *L) {
  int i, e;
  unsigned int n;
  luaL_checktype(L, 1, LUA_TTABLE);
  i = luaL_optint(L, 2, 1);
  e = luaL_opt(L, luaL_checkint, 3, luaL_len(L, 1));
  if (i > e) return 0;  /* empty range */
  n = (unsigned int)e - (unsigned int)i;  /* number of elements minus 1 */
  if (n > (INT_MAX - 10) || !lua_checkstack(L, ++n))
    return luaL_error(L, "too many results to unpack");
  lua_rawgeti(L, 1, i);  /* push arg[i] (avoiding overflow problems) */
  while (i++ < e)  /* push arg[i + 1...e] */
    lua_rawgeti(L, 1, i);
  return n;
}